

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
~ParticleArrayTest_Size_Test
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
  ~ParticleArrayTest((ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
                      *)0x21650e);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}